

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::anon_unknown_2::UnderscoresToCamelCase
                   (string *__return_storage_ptr__,string *name,bool cap_first_letter)

{
  byte bVar1;
  string *psVar2;
  char cVar3;
  string *psVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar3 = (char)__return_storage_ptr__;
  if (name->_M_string_length == 0) {
    psVar2 = (string *)0x0;
  }
  else {
    psVar4 = (string *)0x0;
    do {
      bVar1 = (name->_M_dataplus)._M_p[(long)&(psVar4->_M_dataplus)._M_p];
      if ((char)bVar1 < 'a') {
        if ((char)bVar1 < 'A') {
          if ((byte)(bVar1 - 0x30) < 10) {
            std::__cxx11::string::push_back(cVar3);
          }
        }
        else if (bVar1 < 0x5b) goto LAB_00278cf0;
      }
      else if (bVar1 < 0x7b) {
LAB_00278cf0:
        std::__cxx11::string::push_back(cVar3);
      }
      psVar4 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 1);
      psVar2 = (string *)name->_M_string_length;
    } while (psVar4 < psVar2);
  }
  if (((name->_M_dataplus)._M_p + -1)[(long)psVar2] == '#') {
    psVar2 = (string *)std::__cxx11::string::push_back(cVar3);
  }
  return psVar2;
}

Assistant:

std::string UnderscoresToCamelCase(const std::string& name,
                                   bool cap_first_letter) {
  std::string result;
  for (int i = 0; i < name.size(); i++) {
    if ('a' <= name[i] && name[i] <= 'z') {
      if (cap_first_letter) {
        result += name[i] + ('A' - 'a');
      } else {
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('A' <= name[i] && name[i] <= 'Z') {
      if (i == 0 && !cap_first_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += name[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('0' <= name[i] && name[i] <= '9') {
      result += name[i];
      cap_first_letter = true;
    } else {
      cap_first_letter = true;
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (name[name.size() - 1] == '#') {
    result += '_';
  }
  return result;
}